

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemViewPrivate::columnsAboutToBeRemoved
          (QAbstractItemViewPrivate *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar1;
  Span *pSVar2;
  QWidget *editor;
  undefined1 *puVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  QModelIndex local_b0;
  QModelIndex local_98;
  undefined8 local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  *(undefined4 *)(*(long *)(this_00 + 8) + 0x3a8) = 5;
  local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_78,this_00);
  if ((((-1 < (int)((uint)local_78 | local_78._4_4_)) && (local_68.ptr != (QAbstractItemModel *)0x0)
       ) && (this->selectionMode == SingleSelection)) &&
     ((start <= (int)local_78._4_4_ && ((int)local_78._4_4_ <= end)))) {
    iVar6 = (**(code **)(*(long *)this->model + 0x80))(this->model,parent);
    if (end - start < iVar6) {
      local_98._0_8_ = (undefined1 *)0xffffffffffffffff;
      local_98.i = 0;
      local_98.m.ptr = (QAbstractItemModel *)0x0;
      pQVar1 = this->model;
      QModelIndex::parent(&local_58,(QModelIndex *)&local_78);
      iVar7 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&local_58);
      for (iVar6 = end; puVar3 = local_78, iVar6 < iVar7; iVar6 = iVar6 + 1) {
        pQVar1 = this->model;
        QModelIndex::parent(&local_b0,(QModelIndex *)&local_78);
        (**(code **)(*(long *)pQVar1 + 0x60))
                  (&local_58,pQVar1,(ulong)puVar3 & 0xffffffff,iVar6,&local_b0);
        local_98.m.ptr = local_58.m.ptr;
        local_98._0_8_ = local_58._0_8_;
        local_98.i = local_58.i;
        cVar4 = (**(code **)(*(long *)this_00 + 0x2c0))(this_00,&local_98);
        if ((cVar4 == '\0') &&
           (uVar8 = (**(code **)(*(long *)this->model + 0x138))(this->model,&local_98),
           (uVar8 & 0x20) != 0)) break;
      }
    }
    else {
      local_98.m.ptr = (parent->m).ptr;
      local_98._0_8_ = *(undefined8 *)parent;
      local_98.i = parent->i;
      while( true ) {
        if (((local_98.r < 0) || ((long)local_98._0_8_ < 0)) ||
           (local_98.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_004e9049;
        uVar8 = (**(code **)(*(long *)this->model + 0x138))(this->model,&local_98);
        if ((uVar8 & 0x20) != 0) break;
        QModelIndex::parent(&local_58,&local_98);
        local_98.m.ptr = local_58.m.ptr;
        local_98._0_8_ = local_58._0_8_;
        local_98.i = local_58.i;
      }
LAB_004e9049:
      if (((local_98.r < 0) || (local_98.c < 0)) || (local_98.m.ptr == (QAbstractItemModel *)0x0))
      goto LAB_004e9065;
    }
    QAbstractItemView::setCurrentIndex(this_00,&local_98);
  }
LAB_004e9065:
  local_b0._0_16_ = QHash<QWidget_*,_QPersistentModelIndex>::begin(&this->editorIndexHash);
LAB_004e90a4:
  do {
    if (local_b0._0_8_ == (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0 &&
        local_b0.i == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    pSVar2 = (local_b0._0_8_)->spans;
    uVar8 = local_b0.i >> 7;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_98,
               (QPersistentModelIndex *)
               (pSVar2[uVar8].entries[pSVar2[uVar8].offsets[(uint)local_b0.i & 0x7f]].storage.data +
               8));
    if (end <= local_98.c && local_98.c <= start) {
      (**(code **)(*(long *)this->model + 0x68))(&local_58,this->model,&local_98);
      bVar5 = ::comparesEqual(&local_58,parent);
      if (bVar5) {
        pSVar2 = *(Span **)(local_b0._0_8_ + 0x20);
        uVar8 = local_b0.i >> 7;
        uVar9 = (uint)local_b0.i & 0x7f;
        editor = *(QWidget **)pSVar2[uVar8].entries[pSVar2[uVar8].offsets[uVar9]].storage.data;
        local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QHash<QPersistentModelIndex,_QEditorInfo>::takeImpl<QPersistentModelIndex>
                  ((QEditorInfo *)&local_58,&this->indexEditorHash,
                   (QPersistentModelIndex *)
                   (pSVar2[uVar8].entries[pSVar2[uVar8].offsets[uVar9]].storage.data + 8));
        local_b0._0_16_ =
             QHash<QWidget_*,_QPersistentModelIndex>::erase
                       (&this->editorIndexHash,(const_iterator)local_b0._0_16_);
        bVar5 = QPointer::operator_cast_to_bool((QPointer *)&local_58);
        if (bVar5) {
          releaseEditor(this,editor,&local_98);
        }
        QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_58);
        goto LAB_004e90a4;
      }
    }
    QHashPrivate::iterator<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_>::operator++
              ((iterator<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)&local_b0);
  } while( true );
}

Assistant:

void QAbstractItemViewPrivate::columnsAboutToBeRemoved(const QModelIndex &parent, int start, int end)
{
    Q_Q(QAbstractItemView);

    q->setState(QAbstractItemView::CollapsingState);

    // Ensure one selected item in single selection mode.
    QModelIndex current = q->currentIndex();
    if (current.isValid()
        && selectionMode == QAbstractItemView::SingleSelection
        && current.column() >= start
        && current.column() <= end) {
        int totalToRemove = end - start + 1;
        if (model->columnCount(parent) < totalToRemove) { // no more columns
            QModelIndex index = parent;
            while (index.isValid() && !isIndexEnabled(index))
                index = index.parent();
            if (index.isValid())
                q->setCurrentIndex(index);
        } else {
            int column = end;
            QModelIndex next;
            const int columnCount = model->columnCount(current.parent());
            // find the next visible and enabled item
            while (column < columnCount) {
                next = model->index(current.row(), column++, current.parent());
#ifdef QT_DEBUG
                if (!next.isValid()) {
                    qWarning("Model unexpectedly returned an invalid index");
                    break;
                }
#endif
                if (!q->isIndexHidden(next) && isIndexEnabled(next))
                    break;
            }
            q->setCurrentIndex(next);
        }
    }

    // Remove all affected editors; this is more efficient than waiting for updateGeometries() to clean out editors for invalid indexes
    QEditorIndexHash::iterator it = editorIndexHash.begin();
    while (it != editorIndexHash.end()) {
        QModelIndex index = it.value();
        if (index.column() <= start && index.column() >= end && model->parent(index) == parent) {
            QWidget *editor = it.key();
            QEditorInfo info = indexEditorHash.take(it.value());
            it = editorIndexHash.erase(it);
            if (info.widget)
                releaseEditor(editor, index);
        } else {
            ++it;
        }
    }

}